

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabFactory.H
# Opt level: O1

TagBox * __thiscall
amrex::DefaultFabFactory<amrex::TagBox>::create
          (DefaultFabFactory<amrex::TagBox> *this,Box *box,int ncomps,FabInfo *info,int param_4)

{
  bool bVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  BaseFab<char> *this_00;
  
  this_00 = (BaseFab<char> *)operator_new(0x48);
  bVar1 = info->alloc;
  bVar2 = info->shared;
  (this_00->super_DataAllocator).m_arena = info->arena;
  this_00->_vptr_BaseFab = (_func_int **)&PTR__BaseFab_00750948;
  this_00->dptr = (char *)0x0;
  uVar3 = *(undefined8 *)(box->smallend).vect;
  uVar4 = *(undefined8 *)((box->smallend).vect + 2);
  uVar5 = *(undefined8 *)((box->bigend).vect + 2);
  *(undefined8 *)(this_00->domain).bigend.vect = *(undefined8 *)(box->bigend).vect;
  *(undefined8 *)((this_00->domain).bigend.vect + 2) = uVar5;
  *(undefined8 *)(this_00->domain).smallend.vect = uVar3;
  *(undefined8 *)((this_00->domain).smallend.vect + 2) = uVar4;
  this_00->nvar = ncomps;
  this_00->truesize = 0;
  this_00->ptr_owner = false;
  this_00->shared_memory = bVar2;
  if (bVar1 == true && bVar2 == false) {
    BaseFab<char>::define(this_00);
  }
  this_00->_vptr_BaseFab = (_func_int **)&PTR__BaseFab_00750888;
  return (TagBox *)this_00;
}

Assistant:

AMREX_NODISCARD
    virtual FAB* create (const Box& box, int ncomps, const FabInfo& info, int /*box_index*/) const override
    {
        return new FAB(box, ncomps, info.alloc, info.shared, info.arena);
    }